

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O3

void luaL_pushresult(luaL_Buffer *B)

{
  lua_State *L;
  
  L = B->L;
  lua_pushlstring(L,B->b,B->n);
  if ((anon_union_1024_6_fd43c7cc_for_init *)B->b != &B->init) {
    lua_closeslot(L,-2);
  }
  lua_rotate(L,-2,-1);
  lua_settop(L,-2);
  return;
}

Assistant:

LUALIB_API void luaL_pushresult (luaL_Buffer *B) {
  lua_State *L = B->L;
  checkbufferlevel(B, -1);
  lua_pushlstring(L, B->b, B->n);
  if (buffonstack(B))
    lua_closeslot(L, -2);  /* close the box */
  lua_remove(L, -2);  /* remove box or placeholder from the stack */
}